

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4f39de::PostfixExpr::printLeft(PostfixExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  Node::print(this->Child,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  OutputStream::operator+=(S,this->Operand);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Child->print(S);
    S += ")";
    S += Operand;
  }